

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

_Bool ssh2_transport_filter_queue(ssh2_transport_state *s)

{
  uint uVar1;
  Ssh *ssh;
  _Bool _Var2;
  PktIn *pPVar3;
  char *pcVar4;
  PktIn *pktin;
  ssh2_transport_state *s_local;
  
  while( true ) {
    _Var2 = ssh2_common_filter_queue(&s->ppl);
    if (_Var2) {
      return true;
    }
    pPVar3 = (*((s->ppl).in_pq)->after)
                       (&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,false);
    if (pPVar3 == (PktIn *)0x0) {
      return false;
    }
    if (pPVar3->type < 0x32) {
      return false;
    }
    if ((s->higher_layer_ok & 1U) == 0) break;
    (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
    pq_base_push(&(s->pq_in_higher).pqb,&pPVar3->qnode);
  }
  ssh = (s->ppl).ssh;
  uVar1 = pPVar3->type;
  pcVar4 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pPVar3->type);
  ssh_proto_error(ssh,"Received premature higher-layer packet, type %d (%s)",(ulong)uVar1,pcVar4);
  return true;
}

Assistant:

static bool ssh2_transport_filter_queue(struct ssh2_transport_state *s)
{
    PktIn *pktin;

    while (1) {
        if (ssh2_common_filter_queue(&s->ppl))
            return true;
        if ((pktin = pq_peek(s->ppl.in_pq)) == NULL)
            return false;

        /* Pass on packets to the next layer if they're outside
         * the range reserved for the transport protocol. */
        if (pktin->type >= 50) {
            /* ... except that we shouldn't tolerate higher-layer
             * packets coming from the server before we've seen
             * the first NEWKEYS. */
            if (!s->higher_layer_ok) {
                ssh_proto_error(s->ppl.ssh, "Received premature higher-"
                                "layer packet, type %d (%s)", pktin->type,
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type));
                return true;
            }

            pq_pop(s->ppl.in_pq);
            pq_push(&s->pq_in_higher, pktin);
        } else {
            /* Anything else is a transport-layer packet that the main
             * process_queue coroutine should handle. */
            return false;
        }
    }
}